

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_string(basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            string_view_type *sv,semantic_tag tag,ser_context *param_3,error_code *ec)

{
  const_iterator __position;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  char *pcVar4;
  pointer puVar5;
  bson_errc __e;
  uint8_t code;
  size_type sVar6;
  size_type sVar7;
  size_t length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  decimal128_from_chars_result dVar12;
  basic_string_view<char,_std::char_traits<char>_> bVar13;
  type tVar14;
  value_type_conflict b;
  decimal128_t dec;
  
  if ((this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __e = expected_bson_document;
    goto LAB_001b685e;
  }
  if (tag == code) {
    code = '\r';
  }
  else {
    if (tag == id) {
      before_value(this,'\a');
      oid_t::oid_t((oid_t *)&dec,sv);
      for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 1) {
        b = *(value_type_conflict *)((long)&dec.low + lVar11);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buffer_,&b);
      }
      return true;
    }
    if (tag == regex) {
      before_value(this,'\v');
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find(sv,'/',0);
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                        (sv,'/',0xffffffffffffffff);
      if (((sVar6 != sVar7) && (sVar6 != 0xffffffffffffffff)) && (sVar7 != 0xffffffffffffffff)) {
        bVar13 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (sv,sVar6 + 1,sVar7 - 1);
        pvVar8 = &this->buffer_;
        for (sVar9 = 0; bVar13._M_len != sVar9; sVar9 = sVar9 + 1) {
          dec.low = CONCAT71(dec.low._1_7_,bVar13._M_str[sVar9]);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (pvVar8,(uchar *)&dec);
        }
        dec.low = (ulong)dec.low._1_7_ << 8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (pvVar8,(uchar *)&dec);
        bVar13 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (sv,sVar7 + 1,0xffffffffffffffff);
        for (sVar9 = 0; bVar13._M_len != sVar9; sVar9 = sVar9 + 1) {
          dec.low = CONCAT71(dec.low._1_7_,bVar13._M_str[sVar9]);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (pvVar8,(uchar *)&dec);
        }
        dec.low = (ulong)dec.low._1_7_ << 8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (pvVar8,(uchar *)&dec);
        return true;
      }
      __e = invalid_regex_string;
      goto LAB_001b685e;
    }
    if (tag == float128) {
      before_value(this,'\x13');
      dec.low = 0;
      dec.high = 0;
      dVar12 = decimal128_from_chars(sv->_M_str,sv->_M_str + sv->_M_len,&dec);
      if (dVar12.ec == 0) {
        binary::
        native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                  (dec.low,(back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )&this->buffer_);
        binary::
        native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                  (dec.high,(back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             )&this->buffer_);
        return true;
      }
      __e = invalid_decimal128_string;
      goto LAB_001b685e;
    }
    code = '\x02';
  }
  before_value(this,code);
  pvVar8 = &this->buffer_;
  __position._M_current =
       (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  dec.low = dec.low & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (pvVar8,__position,4,(value_type_conflict *)&dec);
  puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  tVar14 = unicode_traits::validate<char>((unicode_traits *)sv->_M_str,(char *)sv->_M_len,length);
  if (tVar14.ec == success) {
    sVar9 = sv->_M_len;
    pcVar4 = sv->_M_str;
    for (sVar10 = 0; sVar9 != sVar10; sVar10 = sVar10 + 1) {
      dec.low = CONCAT71(dec.low._1_7_,pcVar4[sVar10]);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (pvVar8,(uchar *)&dec);
    }
    dec.low = (ulong)dec.low._1_7_ << 8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (pvVar8,(uchar *)&dec);
    puVar5 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    binary::
    native_to_little<unsigned_int,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
              (((int)puVar2 +
               *(int *)&(this->buffer_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish) - ((int)puVar3 + (int)puVar5),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(__position._M_current + ((long)puVar5 - (long)puVar1)));
    return true;
  }
  __e = invalid_utf8_text_string;
LAB_001b685e:
  std::error_code::operator=(ec,__e);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code& ec) override
    {
        if (stack_.empty())
        {
            ec = bson_errc::expected_bson_document;
            JSONCONS_VISITOR_RETURN;
        }

        switch (tag)
        {
            case semantic_tag::float128:
            {
                before_value(jsoncons::bson::bson_type::decimal128_type);
                decimal128_t dec;
                auto rc = decimal128_from_chars(sv.data(), sv.data()+sv.size(), dec);
                if (rc.ec != std::errc())
                {
                    ec = bson_errc::invalid_decimal128_string;
                    JSONCONS_VISITOR_RETURN;
                }
                binary::native_to_little(dec.low,std::back_inserter(buffer_));
                binary::native_to_little(dec.high,std::back_inserter(buffer_));
                break;
            }
            case semantic_tag::id:
            {
                before_value(jsoncons::bson::bson_type::object_id_type);
                oid_t oid(sv);
                for (auto b : oid)
                {
                    buffer_.push_back(b);
                }
                break;
            }
            case semantic_tag::regex:
            {
                before_value(jsoncons::bson::bson_type::regex_type);
                std::size_t first = sv.find_first_of('/');
                std::size_t last = sv.find_last_of('/');
                if (first == string_view::npos || last == string_view::npos || first == last)
                {
                    ec = bson_errc::invalid_regex_string;
                    JSONCONS_VISITOR_RETURN;
                }
                string_view regex = sv.substr(first+1,last-1);
                for (auto c : regex)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                string_view options = sv.substr(last+1);
                for (auto c : options)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                break;
            }
            default:
                switch (tag)
                {
                    case semantic_tag::code:
                        before_value(jsoncons::bson::bson_type::javascript_type);
                        break;
                    default:
                        before_value(jsoncons::bson::bson_type::string_type);
                        break;
                }
                std::size_t offset = buffer_.size();
                buffer_.insert(buffer_.end(), sizeof(int32_t), 0);
                std::size_t string_offset = buffer_.size();
                auto sink = unicode_traits::validate(sv.data(), sv.size());
                if (sink.ec != unicode_traits::conv_errc())
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    JSONCONS_VISITOR_RETURN;
                }
                for (auto c : sv)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                std::size_t length = buffer_.size() - string_offset;
                binary::native_to_little(static_cast<uint32_t>(length), buffer_.begin()+offset);
                break;
        }

        JSONCONS_VISITOR_RETURN;
    }